

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O1

_Bool X86_insn_reg_intel2(uint id,x86_reg *reg1,cs_ac_type *access1,x86_reg *reg2,
                         cs_ac_type *access2)

{
  insn_reg2 *piVar1;
  x86_reg xVar2;
  ulong uVar3;
  ulong uVar4;
  insn_reg2 *piVar5;
  _Bool _Var6;
  
  piVar5 = insn_regs_intel2;
  if (id == 0x395) {
    _Var6 = true;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (uVar4 == 7) {
        return uVar4 < 7;
      }
      piVar1 = piVar5 + 1;
      piVar5 = piVar5 + 1;
      uVar3 = uVar4 + 1;
    } while (piVar1->insn != id);
    _Var6 = uVar4 < 7;
  }
  xVar2 = piVar5->reg2;
  *reg1 = piVar5->reg1;
  *reg2 = xVar2;
  if (access1 != (cs_ac_type *)0x0) {
    *access1 = piVar5->access1;
  }
  if (access2 == (cs_ac_type *)0x0) {
    return _Var6;
  }
  *access2 = piVar5->access2;
  return _Var6;
}

Assistant:

bool X86_insn_reg_intel2(unsigned int id, x86_reg *reg1, enum cs_ac_type *access1, x86_reg *reg2, enum cs_ac_type *access2)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel2); i++) {
		if (insn_regs_intel2[i].insn == id) {
			*reg1 = insn_regs_intel2[i].reg1;
			*reg2 = insn_regs_intel2[i].reg2;
			if (access1)
				*access1 = insn_regs_intel2[i].access1;
			if (access2)
				*access2 = insn_regs_intel2[i].access2;
			return true;
		}
	}

	// not found
	return false;
}